

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::GetMemOpSrcInfo
          (GlobOpt *this,Loop *loop,Instr *instr,RegOpnd **base,RegOpnd **index,IRType *arrayType)

{
  Opnd *this_00;
  RegOpnd *pRVar1;
  RegOpnd *pRVar2;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  undefined4 *puVar6;
  IndirOpnd *pIVar7;
  
  if (instr == (Instr *)0x0) {
LAB_00443563:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x438e,
                       "(instr && (instr->m_opcode == Js::OpCode::LdElemI_A || instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict))"
                       ,
                       "instr && (instr->m_opcode == Js::OpCode::LdElemI_A || instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)"
                      );
    if (!bVar4) goto LAB_00443710;
    *puVar6 = 0;
    OVar5 = instr->m_opcode;
  }
  else {
    OVar5 = instr->m_opcode;
    if ((5 < OVar5 - 0x97) || ((0x29U >> (OVar5 - 0x97 & 0x1f) & 1) == 0)) goto LAB_00443563;
  }
  this_00 = (&instr->m_dst)[OVar5 == LdElemI_A];
  bVar4 = IR::Opnd::IsIndirOpnd(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4390,"(arrayOpnd->IsIndirOpnd())","arrayOpnd->IsIndirOpnd()");
    if (!bVar4) goto LAB_00443710;
    *puVar6 = 0;
  }
  pIVar7 = IR::Opnd::AsIndirOpnd(this_00);
  pRVar1 = pIVar7->m_baseOpnd;
  pRVar2 = pIVar7->m_indexOpnd;
  if (pRVar1 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4395,"(baseOpnd)","baseOpnd");
    if (!bVar4) goto LAB_00443710;
    *puVar6 = 0;
  }
  if (pRVar2 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4396,"(indexOpnd)","indexOpnd");
    if (!bVar4) {
LAB_00443710:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  *base = pRVar1;
  *index = pRVar2;
  *arrayType = (pIVar7->super_Opnd).m_type;
  return;
}

Assistant:

void
GlobOpt::GetMemOpSrcInfo(Loop* loop, IR::Instr* instr, IR::RegOpnd*& base, IR::RegOpnd*& index, IRType& arrayType)
{
    Assert(instr && (instr->m_opcode == Js::OpCode::LdElemI_A || instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict));
    IR::Opnd* arrayOpnd = instr->m_opcode == Js::OpCode::LdElemI_A ? instr->GetSrc1() : instr->GetDst();
    Assert(arrayOpnd->IsIndirOpnd());

    IR::IndirOpnd* indirArrayOpnd = arrayOpnd->AsIndirOpnd();
    IR::RegOpnd* baseOpnd = (IR::RegOpnd*)indirArrayOpnd->GetBaseOpnd();
    IR::RegOpnd* indexOpnd = (IR::RegOpnd*)indirArrayOpnd->GetIndexOpnd();
    Assert(baseOpnd);
    Assert(indexOpnd);

    // Process Out Params
    base = baseOpnd;
    index = indexOpnd;
    arrayType = indirArrayOpnd->GetType();
}